

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_code.hpp
# Opt level: O0

bool __thiscall
boost::system::error_category::std_category::equivalent
          (std_category *this,error_code *code,int condition)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  error_category *peVar4;
  error_category *peVar5;
  error_category *peVar6;
  error_category *rhs;
  long *plVar7;
  undefined4 in_EDX;
  error_code *in_RSI;
  error_category *in_RDI;
  error_code bc_2;
  std_category *pc2;
  error_code bc_1;
  error_code bc;
  long local_88;
  error_code local_58;
  long local_48;
  error_code local_40;
  error_code local_30;
  undefined4 local_1c;
  error_code *local_18;
  bool local_1;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  peVar4 = std::error_code::category(in_RSI);
  bVar1 = std::_V2::error_category::operator==(peVar4,in_RDI);
  if (bVar1) {
    iVar3 = std::error_code::value(local_18);
    error_code::error_code(&local_30,iVar3,*(error_category **)(in_RDI + 8));
    bVar2 = (**(code **)(**(long **)(in_RDI + 8) + 0x30))(*(long **)(in_RDI + 8),&local_30,local_1c)
    ;
  }
  else {
    peVar4 = std::error_code::category(local_18);
    peVar5 = (error_category *)std::_V2::generic_category();
    bVar1 = std::_V2::error_category::operator==(peVar4,peVar5);
    if (!bVar1) {
      peVar4 = std::error_code::category(local_18);
      peVar6 = generic_category();
      peVar5 = operator_cast_to_error_category_(peVar6);
      bVar1 = std::_V2::error_category::operator==(peVar4,peVar5);
      if (!bVar1) {
        peVar4 = std::error_code::category(local_18);
        if (peVar4 == (error_category *)0x0) {
          local_88 = 0;
        }
        else {
          local_88 = __dynamic_cast(peVar4,&std::_V2::error_category::typeinfo,&typeinfo,0);
        }
        local_48 = local_88;
        if (local_88 != 0) {
          iVar3 = std::error_code::value(local_18);
          error_code::error_code(&local_58,iVar3,*(error_category **)(local_48 + 8));
          bVar2 = (**(code **)(**(long **)(in_RDI + 8) + 0x30))
                            (*(long **)(in_RDI + 8),&local_58,local_1c);
          return (bool)(bVar2 & 1);
        }
        peVar6 = *(error_category **)(in_RDI + 8);
        rhs = generic_category();
        bVar1 = operator==(peVar6,rhs);
        if (!bVar1) {
          return false;
        }
        plVar7 = (long *)std::_V2::generic_category();
        bVar2 = (**(code **)(*plVar7 + 0x38))(plVar7,local_18,local_1c);
        return (bool)(bVar2 & 1);
      }
    }
    iVar3 = std::error_code::value(local_18);
    peVar6 = generic_category();
    error_code::error_code(&local_40,iVar3,peVar6);
    bVar2 = (**(code **)(**(long **)(in_RDI + 8) + 0x30))(*(long **)(in_RDI + 8),&local_40,local_1c)
    ;
  }
  local_1 = (bool)(bVar2 & 1);
  return local_1;
}

Assistant:

inline bool error_category::std_category::equivalent( const std::error_code & code,
      int condition ) const BOOST_NOEXCEPT
    {
      if( code.category() == *this )
      {
        boost::system::error_code bc( code.value(), *pc_ );
        return pc_->equivalent( bc, condition );
      }
      else if( code.category() == std::generic_category()
        || code.category() == boost::system::generic_category() )
      {
        boost::system::error_code bc( code.value(),
          boost::system::generic_category() );

        return pc_->equivalent( bc, condition );
      }
#ifndef BOOST_NO_RTTI
      else if( std_category const* pc2 = dynamic_cast< std_category const* >(
        &code.category() ) )
      {
        boost::system::error_code bc( code.value(), *pc2->pc_ );
        return pc_->equivalent( bc, condition );
      }
#endif
      else if( *pc_ == boost::system::generic_category() )
      {
        return std::generic_category().equivalent( code, condition );
      }
      else
      {
        return false;
      }
    }